

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O0

bool __thiscall
glslang::TOutputTraverser::visitSelection
          (TOutputTraverser *this,TVisit param_1,TIntermSelection *node)

{
  bool bVar1;
  TInfoSinkBase *pTVar2;
  long *plVar3;
  long lVar4;
  TString local_50;
  TInfoSink *local_28;
  TInfoSink *out;
  TIntermSelection *node_local;
  TOutputTraverser *pTStack_10;
  TVisit param_1_local;
  TOutputTraverser *this_local;
  
  local_28 = this->infoSink;
  out = (TInfoSink *)node;
  node_local._4_4_ = param_1;
  pTStack_10 = this;
  OutputTreeText(local_28,(TIntermNode *)node,(this->super_TIntermTraverser).depth);
  TInfoSinkBase::operator<<(&local_28->debug,"Test condition and select");
  pTVar2 = TInfoSinkBase::operator<<(&local_28->debug," (");
  TIntermTyped::getCompleteString_abi_cxx11_(&local_50,(TIntermTyped *)out,false);
  pTVar2 = TInfoSinkBase::operator<<(pTVar2,&local_50);
  TInfoSinkBase::operator<<(pTVar2,")");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_50);
  bVar1 = TIntermSelection::getShortCircuit((TIntermSelection *)out);
  if (!bVar1) {
    TInfoSinkBase::operator<<(&local_28->debug,": no shortcircuit");
  }
  bVar1 = TIntermSelection::getFlatten((TIntermSelection *)out);
  if (bVar1) {
    TInfoSinkBase::operator<<(&local_28->debug,": Flatten");
  }
  bVar1 = TIntermSelection::getDontFlatten((TIntermSelection *)out);
  if (bVar1) {
    TInfoSinkBase::operator<<(&local_28->debug,": DontFlatten");
  }
  TInfoSinkBase::operator<<(&local_28->debug,"\n");
  (this->super_TIntermTraverser).depth = (this->super_TIntermTraverser).depth + 1;
  OutputTreeText(local_28,(TIntermNode *)out,(this->super_TIntermTraverser).depth);
  TInfoSinkBase::operator<<(&local_28->debug,"Condition\n");
  plVar3 = (long *)(**(code **)(*(long *)&(out->info).sink + 0x180))();
  (**(code **)(*plVar3 + 0x10))(plVar3,this);
  OutputTreeText(local_28,(TIntermNode *)out,(this->super_TIntermTraverser).depth);
  lVar4 = (**(code **)(*(long *)&(out->info).sink + 400))();
  if (lVar4 == 0) {
    TInfoSinkBase::operator<<(&local_28->debug,"true case is null\n");
  }
  else {
    TInfoSinkBase::operator<<(&local_28->debug,"true case\n");
    plVar3 = (long *)(**(code **)(*(long *)&(out->info).sink + 400))();
    (**(code **)(*plVar3 + 0x10))(plVar3,this);
  }
  lVar4 = (**(code **)(*(long *)&(out->info).sink + 0x1a0))();
  if (lVar4 != 0) {
    OutputTreeText(local_28,(TIntermNode *)out,(this->super_TIntermTraverser).depth);
    TInfoSinkBase::operator<<(&local_28->debug,"false case\n");
    plVar3 = (long *)(**(code **)(*(long *)&(out->info).sink + 0x1a0))();
    (**(code **)(*plVar3 + 0x10))(plVar3,this);
  }
  (this->super_TIntermTraverser).depth = (this->super_TIntermTraverser).depth + -1;
  return false;
}

Assistant:

bool TOutputTraverser::visitSelection(TVisit /* visit */, TIntermSelection* node)
{
    TInfoSink& out = infoSink;

    OutputTreeText(out, node, depth);

    out.debug << "Test condition and select";
    out.debug << " (" << node->getCompleteString() << ")";

    if (node->getShortCircuit() == false)
        out.debug << ": no shortcircuit";
    if (node->getFlatten())
        out.debug << ": Flatten";
    if (node->getDontFlatten())
        out.debug << ": DontFlatten";
    out.debug << "\n";

    ++depth;

    OutputTreeText(out, node, depth);
    out.debug << "Condition\n";
    node->getCondition()->traverse(this);

    OutputTreeText(out, node, depth);
    if (node->getTrueBlock()) {
        out.debug << "true case\n";
        node->getTrueBlock()->traverse(this);
    } else
        out.debug << "true case is null\n";

    if (node->getFalseBlock()) {
        OutputTreeText(out, node, depth);
        out.debug << "false case\n";
        node->getFalseBlock()->traverse(this);
    }

    --depth;

    return false;
}